

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wyhash.h
# Opt level: O0

uint64_t wyhash(void *key,uint64_t len,uint64_t seed)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *p_00;
  ulong in_RDX;
  ulong in_RSI;
  uint8_t *in_RDI;
  uint64_t i;
  uint64_t see1;
  uint8_t *p;
  uint8_t *in_stack_fffffffffffffed0;
  ulong local_38;
  ulong local_30;
  uint8_t *local_28;
  ulong local_20;
  uint64_t local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    local_38 = in_RSI;
    local_30 = in_RDX;
    local_28 = in_RDI;
    local_20 = in_RDX;
    if (0x20 < in_RSI) {
      for (; 0x100 < local_38; local_38 = local_38 - 0x100) {
        uVar1 = _wyr8(local_28);
        uVar2 = _wyr8(local_28 + 8);
        uVar1 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,uVar2 ^ local_20 ^ 0xe7037ed1a0b428db);
        uVar2 = _wyr8(local_28 + 0x10);
        uVar3 = _wyr8(local_28 + 0x18);
        uVar2 = _wymum(uVar2 ^ local_20 ^ 0x8ebc6af09c88c6e3,uVar3 ^ local_20 ^ 0x589965cc75374cc3);
        uVar4 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0x20);
        uVar2 = _wyr8(local_28 + 0x28);
        uVar1 = _wymum(uVar1 ^ local_30 ^ 0xe7037ed1a0b428db,uVar2 ^ local_30 ^ 0x8ebc6af09c88c6e3);
        uVar2 = _wyr8(local_28 + 0x30);
        uVar3 = _wyr8(local_28 + 0x38);
        uVar2 = _wymum(uVar2 ^ local_30 ^ 0x589965cc75374cc3,uVar3 ^ local_30 ^ 0xa0761d6478bd642f);
        uVar5 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0x40);
        uVar2 = _wyr8(local_28 + 0x48);
        uVar1 = _wymum(uVar1 ^ uVar4 ^ 0xa0761d6478bd642f,uVar2 ^ uVar4 ^ 0xe7037ed1a0b428db);
        uVar2 = _wyr8(local_28 + 0x50);
        uVar3 = _wyr8(local_28 + 0x58);
        uVar2 = _wymum(uVar2 ^ uVar4 ^ 0x8ebc6af09c88c6e3,uVar3 ^ uVar4 ^ 0x589965cc75374cc3);
        uVar4 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0x60);
        uVar2 = _wyr8(local_28 + 0x68);
        uVar1 = _wymum(uVar1 ^ uVar5 ^ 0xe7037ed1a0b428db,uVar2 ^ uVar5 ^ 0x8ebc6af09c88c6e3);
        uVar2 = _wyr8(local_28 + 0x70);
        uVar3 = _wyr8(local_28 + 0x78);
        uVar2 = _wymum(uVar2 ^ uVar5 ^ 0x589965cc75374cc3,uVar3 ^ uVar5 ^ 0xa0761d6478bd642f);
        uVar5 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0x80);
        uVar2 = _wyr8(local_28 + 0x88);
        uVar1 = _wymum(uVar1 ^ uVar4 ^ 0xa0761d6478bd642f,uVar2 ^ uVar4 ^ 0xe7037ed1a0b428db);
        uVar2 = _wyr8(local_28 + 0x90);
        uVar3 = _wyr8(local_28 + 0x98);
        uVar2 = _wymum(uVar2 ^ uVar4 ^ 0x8ebc6af09c88c6e3,uVar3 ^ uVar4 ^ 0x589965cc75374cc3);
        uVar4 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0xa0);
        uVar2 = _wyr8(local_28 + 0xa8);
        uVar1 = _wymum(uVar1 ^ uVar5 ^ 0xe7037ed1a0b428db,uVar2 ^ uVar5 ^ 0x8ebc6af09c88c6e3);
        uVar2 = _wyr8(local_28 + 0xb0);
        uVar3 = _wyr8(local_28 + 0xb8);
        uVar2 = _wymum(uVar2 ^ uVar5 ^ 0x589965cc75374cc3,uVar3 ^ uVar5 ^ 0xa0761d6478bd642f);
        uVar5 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0xc0);
        uVar2 = _wyr8(local_28 + 200);
        uVar1 = _wymum(uVar1 ^ uVar4 ^ 0xa0761d6478bd642f,uVar2 ^ uVar4 ^ 0xe7037ed1a0b428db);
        uVar2 = _wyr8(local_28 + 0xd0);
        uVar3 = _wyr8(local_28 + 0xd8);
        uVar2 = _wymum(uVar2 ^ uVar4 ^ 0x8ebc6af09c88c6e3,uVar3 ^ uVar4 ^ 0x589965cc75374cc3);
        local_20 = uVar1 ^ uVar2;
        uVar1 = _wyr8(local_28 + 0xe0);
        uVar2 = _wyr8(local_28 + 0xe8);
        uVar1 = _wymum(uVar1 ^ uVar5 ^ 0xe7037ed1a0b428db,uVar2 ^ uVar5 ^ 0x8ebc6af09c88c6e3);
        uVar2 = _wyr8(local_28 + 0xf0);
        uVar3 = _wyr8(local_28 + 0xf8);
        uVar2 = _wymum(uVar2 ^ uVar5 ^ 0x589965cc75374cc3,uVar3 ^ uVar5 ^ 0xa0761d6478bd642f);
        local_30 = uVar1 ^ uVar2;
        local_28 = local_28 + 0x100;
      }
      for (; 0x20 < local_38; local_38 = local_38 - 0x20) {
        uVar1 = _wyr8(local_28);
        uVar2 = _wyr8(local_28 + 8);
        local_20 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,
                          uVar2 ^ local_20 ^ 0xe7037ed1a0b428db);
        uVar1 = _wyr8(local_28 + 0x10);
        uVar2 = _wyr8(local_28 + 0x18);
        local_30 = _wymum(uVar1 ^ local_30 ^ 0x8ebc6af09c88c6e3,
                          uVar2 ^ local_30 ^ 0x589965cc75374cc3);
        local_28 = local_28 + 0x20;
      }
    }
    if (local_38 < 4) {
      uVar1 = _wyr3(local_28,(uint)local_38);
      local_20 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,local_20 ^ 0xe7037ed1a0b428db);
    }
    else if (local_38 < 9) {
      uVar1 = _wyr4(local_28);
      uVar2 = _wyr4(local_28 + (local_38 - 4));
      local_20 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,uVar2 ^ local_20 ^ 0xe7037ed1a0b428db)
      ;
    }
    else if (local_38 < 0x11) {
      uVar1 = __wyr8(in_stack_fffffffffffffed0);
      uVar2 = __wyr8(in_stack_fffffffffffffed0);
      local_20 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,uVar2 ^ local_20 ^ 0xe7037ed1a0b428db)
      ;
    }
    else if (local_38 < 0x19) {
      uVar1 = __wyr8(in_stack_fffffffffffffed0);
      uVar2 = __wyr8(in_stack_fffffffffffffed0);
      local_20 = _wymum(uVar1 ^ local_20 ^ 0xa0761d6478bd642f,uVar2 ^ local_20 ^ 0xe7037ed1a0b428db)
      ;
      uVar1 = __wyr8(in_stack_fffffffffffffed0);
      local_30 = _wymum(uVar1 ^ local_30 ^ 0x8ebc6af09c88c6e3,local_30 ^ 0x589965cc75374cc3);
    }
    else {
      uVar1 = __wyr8(in_stack_fffffffffffffed0);
      p_00 = (uint8_t *)(uVar1 ^ local_20 ^ 0xa0761d6478bd642f);
      uVar1 = __wyr8(p_00);
      local_20 = _wymum((uint64_t)p_00,uVar1 ^ local_20 ^ 0xe7037ed1a0b428db);
      uVar1 = __wyr8(p_00);
      uVar2 = __wyr8(p_00);
      local_30 = _wymum(uVar1 ^ local_30 ^ 0x8ebc6af09c88c6e3,uVar2 ^ local_30 ^ 0x589965cc75374cc3)
      ;
    }
    local_8 = _wymum(local_20 ^ local_30,in_RSI ^ 0x1d8e4e27c47d124f);
  }
  return local_8;
}

Assistant:

static	inline	uint64_t	__wyr8(const	uint8_t	*p)	{	return	(_wyr4(p)<<32)|_wyr4(p+4);	}